

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall ImFont::GrowIndex(ImFont *this,int new_size)

{
  int *piVar1;
  int iVar2;
  float *__dest;
  unsigned_short *__dest_00;
  ImGuiContext *pIVar3;
  int iVar4;
  long lVar5;
  float *pfVar6;
  unsigned_short *puVar7;
  long lVar8;
  
  pIVar3 = GImGui;
  iVar2 = (this->IndexXAdvance).Size;
  lVar8 = (long)iVar2;
  if (iVar2 != (this->IndexLookup).Size) {
    __assert_fail("IndexXAdvance.Size == IndexLookup.Size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui_draw.cpp"
                  ,0x6d8,"void ImFont::GrowIndex(int)");
  }
  if (new_size <= iVar2) {
    return;
  }
  iVar4 = (this->IndexXAdvance).Capacity;
  if (iVar4 < new_size) {
    if (iVar4 == 0) {
      iVar4 = 8;
    }
    else {
      iVar4 = iVar4 / 2 + iVar4;
    }
    if (iVar4 <= new_size) {
      iVar4 = new_size;
    }
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + 1;
    __dest = (float *)(*(pIVar3->IO).MemAllocFn)((long)iVar4 << 2);
    pfVar6 = (this->IndexXAdvance).Data;
    if (pfVar6 == (float *)0x0) {
LAB_00154245:
      pfVar6 = (float *)0x0;
      pIVar3 = GImGui;
    }
    else {
      memcpy(__dest,pfVar6,(long)(this->IndexXAdvance).Size << 2);
      pIVar3 = GImGui;
      pfVar6 = (this->IndexXAdvance).Data;
      if (pfVar6 == (float *)0x0) goto LAB_00154245;
      piVar1 = &(GImGui->IO).MetricsAllocs;
      *piVar1 = *piVar1 + -1;
    }
    (*(pIVar3->IO).MemFreeFn)(pfVar6);
    (this->IndexXAdvance).Data = __dest;
    (this->IndexXAdvance).Capacity = iVar4;
  }
  (this->IndexXAdvance).Size = new_size;
  pIVar3 = GImGui;
  iVar4 = (this->IndexLookup).Capacity;
  if (new_size <= iVar4) goto LAB_001542df;
  if (iVar4 == 0) {
    iVar4 = 8;
  }
  else {
    iVar4 = iVar4 / 2 + iVar4;
  }
  if (iVar4 <= new_size) {
    iVar4 = new_size;
  }
  piVar1 = &(GImGui->IO).MetricsAllocs;
  *piVar1 = *piVar1 + 1;
  __dest_00 = (unsigned_short *)(*(pIVar3->IO).MemAllocFn)((long)iVar4 * 2);
  puVar7 = (this->IndexLookup).Data;
  if (puVar7 == (unsigned_short *)0x0) {
LAB_001542cf:
    puVar7 = (unsigned_short *)0x0;
    pIVar3 = GImGui;
  }
  else {
    memcpy(__dest_00,puVar7,(long)(this->IndexLookup).Size * 2);
    pIVar3 = GImGui;
    puVar7 = (this->IndexLookup).Data;
    if (puVar7 == (unsigned_short *)0x0) goto LAB_001542cf;
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + -1;
  }
  (*(pIVar3->IO).MemFreeFn)(puVar7);
  (this->IndexLookup).Data = __dest_00;
  (this->IndexLookup).Capacity = iVar4;
LAB_001542df:
  (this->IndexLookup).Size = new_size;
  iVar4 = (this->IndexXAdvance).Size;
  if (iVar4 < iVar2) {
    iVar4 = iVar2;
  }
  pfVar6 = (this->IndexXAdvance).Data;
  puVar7 = (this->IndexLookup).Data;
  lVar5 = 0;
  do {
    if (iVar4 - lVar8 == lVar5) {
      __assert_fail("i < Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.h"
                    ,0x353,"value_type &ImVector<float>::operator[](int) [T = float]");
    }
    pfVar6[lVar8 + lVar5] = -1.0;
    puVar7[lVar8 + lVar5] = 0xffff;
    lVar5 = lVar5 + 1;
  } while (new_size - iVar2 != (int)lVar5);
  return;
}

Assistant:

void ImFont::GrowIndex(int new_size)
{
    IM_ASSERT(IndexXAdvance.Size == IndexLookup.Size);
    int old_size = IndexLookup.Size;
    if (new_size <= old_size)
        return;
    IndexXAdvance.resize(new_size);
    IndexLookup.resize(new_size);
    for (int i = old_size; i < new_size; i++)
    {
        IndexXAdvance[i] = -1.0f;
        IndexLookup[i] = (unsigned short)-1;
    }
}